

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_validator_options.cpp
# Opt level: O0

bool __thiscall
spvParseUniversalLimitsOptions::anon_class_8_1_54a39813::operator()
          (anon_class_8_1_54a39813 *this,char *b)

{
  char *__s1;
  int iVar1;
  size_t __n;
  bool local_19;
  char *b_local;
  anon_class_8_1_54a39813 *this_local;
  
  local_19 = false;
  if (this->s != (char *)0x0) {
    __s1 = this->s;
    __n = strlen(b);
    iVar1 = strncmp(__s1,b,__n);
    local_19 = iVar1 == 0;
  }
  return local_19;
}

Assistant:

bool spvParseUniversalLimitsOptions(const char* s, spv_validator_limit* type) {
  auto match = [s](const char* b) {
    return s && (0 == strncmp(s, b, strlen(b)));
  };
  if (match("--max-struct-members")) {
    *type = spv_validator_limit_max_struct_members;
  } else if (match("--max-struct_depth")) {
    *type = spv_validator_limit_max_struct_depth;
  } else if (match("--max-local-variables")) {
    *type = spv_validator_limit_max_local_variables;
  } else if (match("--max-global-variables")) {
    *type = spv_validator_limit_max_global_variables;
  } else if (match("--max-switch-branches")) {
    *type = spv_validator_limit_max_global_variables;
  } else if (match("--max-function-args")) {
    *type = spv_validator_limit_max_function_args;
  } else if (match("--max-control-flow-nesting-depth")) {
    *type = spv_validator_limit_max_control_flow_nesting_depth;
  } else if (match("--max-access-chain-indexes")) {
    *type = spv_validator_limit_max_access_chain_indexes;
  } else if (match("--max-id-bound")) {
    *type = spv_validator_limit_max_id_bound;
  } else {
    // The command line option for this validator limit has not been added.
    // Therefore we return false.
    return false;
  }

  return true;
}